

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

void __thiscall ON_PolynomialCurve::Destroy(ON_PolynomialCurve *this)

{
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  ON_SimpleArray<ON_4dPoint>::Destroy(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
  *(undefined4 *)(this->m_domain).m_t = 0;
  *(undefined4 *)((long)(this->m_domain).m_t + 4) = 0;
  *(undefined4 *)((this->m_domain).m_t + 1) = 0;
  *(undefined4 *)((long)(this->m_domain).m_t + 0xc) = 0x3ff00000;
  return;
}

Assistant:

void ON_PolynomialCurve::Destroy()
{
  m_dim = 0;
  m_is_rat = 0;
  m_order = 0;
  m_cv.Destroy();
  m_domain.m_t[0] = 0.0;
  m_domain.m_t[1] = 1.0;
}